

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::anon_unknown_75::channelToFloat(deUint8 *value,ChannelType type)

{
  deUint32 dVar1;
  ChannelType type_local;
  deUint8 *value_local;
  
  switch(type) {
  case SNORM_INT8:
    value_local._4_4_ = de::max<float>(-1.0,(float)(int)(char)*value / 127.0);
    break;
  case SNORM_INT16:
    value_local._4_4_ = de::max<float>(-1.0,(float)(int)*(short *)value / 32767.0);
    break;
  case SNORM_INT32:
    value_local._4_4_ = de::max<float>(-1.0,(float)*(int *)value / 2.1474836e+09);
    break;
  case UNORM_INT8:
    value_local._4_4_ = (float)*value / 255.0;
    break;
  case UNORM_INT16:
    value_local._4_4_ = (float)*(ushort *)value / 65535.0;
    break;
  case UNORM_INT24:
    dVar1 = readUint24(value);
    value_local._4_4_ = (float)dVar1 / 16777215.0;
    break;
  case UNORM_INT32:
    value_local._4_4_ = (float)*(uint *)value / 4.2949673e+09;
    break;
  default:
    value_local._4_4_ = 0.0;
    break;
  case SIGNED_INT8:
    value_local._4_4_ = (float)(int)(char)*value;
    break;
  case SIGNED_INT16:
    value_local._4_4_ = (float)(int)*(short *)value;
    break;
  case SIGNED_INT32:
    value_local._4_4_ = (float)*(int *)value;
    break;
  case UNSIGNED_INT8:
    value_local._4_4_ = (float)*value;
    break;
  case UNSIGNED_INT16:
    value_local._4_4_ = (float)*(ushort *)value;
    break;
  case UNSIGNED_INT24:
    dVar1 = readUint24(value);
    value_local._4_4_ = (float)dVar1;
    break;
  case UNSIGNED_INT32:
    value_local._4_4_ = (float)*(uint *)value;
    break;
  case HALF_FLOAT:
    value_local._4_4_ = deFloat16To32(*(deFloat16 *)value);
    break;
  case FLOAT:
    value_local._4_4_ = *(float *)value;
    break;
  case FLOAT64:
    value_local._4_4_ = (float)*(double *)value;
  }
  return value_local._4_4_;
}

Assistant:

inline float channelToFloat (const deUint8* value, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			return de::max(-1.0f, (float)*((const deInt8*)value) / 127.0f);
		case TextureFormat::SNORM_INT16:		return de::max(-1.0f, (float)*((const deInt16*)value) / 32767.0f);
		case TextureFormat::SNORM_INT32:		return de::max(-1.0f, (float)*((const deInt32*)value) / 2147483647.0f);
		case TextureFormat::UNORM_INT8:			return (float)*((const deUint8*)value) / 255.0f;
		case TextureFormat::UNORM_INT16:		return (float)*((const deUint16*)value) / 65535.0f;
		case TextureFormat::UNORM_INT24:		return (float)readUint24(value) / 16777215.0f;
		case TextureFormat::UNORM_INT32:		return (float)*((const deUint32*)value) / 4294967295.0f;
		case TextureFormat::SIGNED_INT8:		return (float)*((const deInt8*)value);
		case TextureFormat::SIGNED_INT16:		return (float)*((const deInt16*)value);
		case TextureFormat::SIGNED_INT32:		return (float)*((const deInt32*)value);
		case TextureFormat::UNSIGNED_INT8:		return (float)*((const deUint8*)value);
		case TextureFormat::UNSIGNED_INT16:		return (float)*((const deUint16*)value);
		case TextureFormat::UNSIGNED_INT24:		return (float)readUint24(value);
		case TextureFormat::UNSIGNED_INT32:		return (float)*((const deUint32*)value);
		case TextureFormat::HALF_FLOAT:			return deFloat16To32(*(const deFloat16*)value);
		case TextureFormat::FLOAT:				return *((const float*)value);
		case TextureFormat::FLOAT64:			return (float)*((const double*)value);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}